

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardrtn.c
# Opt level: O3

FX * make_FXcopy(FX *fx68k)

{
  int nw;
  DLword *source68k;
  ushort uVar1;
  bool bVar2;
  DLword *pDVar3;
  uint uVar4;
  DLword *pDVar5;
  DLword DVar6;
  FX *pFVar7;
  StackWord *start68k;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar1 = fx68k->nextblock;
  if (((ulong)fx68k & 1) != 0) {
    printf("Misaligned pointer in LAddrFromNative %p\n",fx68k);
  }
  iVar8 = (uint)uVar1 - ((uint)((int)fx68k - (int)Lisp_world) >> 1 & 0xffff);
  nw = iVar8 + 2;
  DVar6 = (DLword)nw;
  if (((fx68k->field_0x3 & 2) == 0) || (*(short *)((long)&fx68k->nametable + 2) != 1)) {
    pDVar5 = freestackblock(DVar6,(StackWord *)(MachineState.pvar + -10),-1);
    bVar2 = true;
  }
  else {
    start68k = (StackWord *)(MachineState.pvar + -10);
    uVar10 = (long)fx68k - (long)Stackspace >> 1;
    if (0xffff < uVar10) {
      printf("Stack offset is out of range: 0x%tx\n",uVar10);
    }
    uVar4 = (uint)uVar10 & 0xffff;
    uVar9 = uVar4 + 1;
    if (-1 < (int)(uVar4 - 2)) {
      uVar9 = uVar4 - 2;
    }
    pDVar5 = freestackblock(DVar6,start68k,(uVar4 - (uVar9 & 0xfffffffc)) + -2);
    bVar2 = false;
  }
  if (pDVar5 == (DLword *)0x0) {
    pFVar7 = (FX *)0x0;
  }
  else {
    source68k = &fx68k[-1].clink;
    blt(pDVar5,source68k,nw);
    *(byte *)((long)pDVar5 + 3) = *(byte *)((long)pDVar5 + 3) | 2;
    pFVar7 = (FX *)(pDVar5 + 2);
    uVar10 = (long)pFVar7 - (long)Stackspace >> 1;
    if (0xffff < uVar10) {
      printf("Stack offset is out of range: 0x%tx\n",uVar10);
    }
    pDVar5[7] = (short)uVar10 + (short)iVar8;
    if ((fx68k->alink & 1) == 0) {
      if (((ulong)source68k & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",source68k);
      }
      uVar4 = (uint)((int)source68k - (int)Lisp_world) >> 1;
    }
    else {
      uVar4 = (uint)fx68k->blink;
    }
    if ((uVar4 & 1) != 0) {
      printf("Misaligned StackOffset in NativeAligned4FromStackOffset 0x%hx\n",
             (ulong)(uVar4 & 0xffff));
    }
    pDVar3 = Stackspace;
    if ((fx68k->alink & 1) == 0) {
      if (((ulong)source68k & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",source68k);
      }
      DVar6 = (DLword)((uint)((int)source68k - (int)Lisp_world) >> 1);
    }
    else {
      DVar6 = fx68k->blink;
    }
    pDVar5[0xb] = DVar6;
    uVar9 = *(uint *)(pDVar5 + 2);
    if ((uVar9 & 1) == 0) {
      pDVar5[10] = (DLword)uVar9;
      *(uint *)(pDVar5 + 2) = uVar9 | 1;
    }
    pDVar5[3] = (ushort)(uVar9 >> 0x10) & 0xff00;
    if (!bVar2) {
      *(int *)(pDVar5 + 8) = *(int *)(pDVar5 + 8) + (int)((ulong)((long)pFVar7 - (long)fx68k) >> 1);
    }
    *(char *)(pDVar3 + (ulong)(uVar4 & 0xffff) + 1) =
         (char)pDVar3[(ulong)(uVar4 & 0xffff) + 1] + '\x01';
    uVar4 = *(uint *)fx68k;
    if ((uVar4 & 1) == 0) {
      uVar10 = (long)source68k - (long)Stackspace >> 1;
      uVar9 = uVar4;
      if (0xffff < uVar10) {
        printf("Stack offset is out of range: 0x%tx\n",uVar10);
        uVar9 = (uint)fx68k->alink;
        uVar4 = *(uint *)fx68k;
      }
      fx68k->blink = (DLword)uVar10;
      fx68k->clink = (DLword)uVar9;
      *(uint *)fx68k = uVar4 | 1;
    }
    uVar4 = *(int *)&fx68k->clink - 10;
    uVar9 = uVar4 & 0xffff;
    if ((uVar4 & 1) != 0) {
      printf("Misaligned StackOffset in NativeAligned4FromStackOffset 0x%hx\n",(ulong)uVar9);
    }
    incusecount68k((FX *)((ulong)(uVar9 * 2) + (long)Stackspace));
    uVar4 = *(uint *)fx68k & 0xfffe;
    if (*(short *)((long)&fx68k->alink + (ulong)((*(uint *)fx68k & 1) << 4)) != (short)uVar4) {
      incusecount68k((FX *)((ulong)((uVar4 - 10 & 0xffff) * 2) + (long)Stackspace));
    }
    decusecount68k(fx68k);
    if ((MachineState.pvar[-10] & 1) == 0) {
      pDVar5 = MachineState.pvar + -0xc;
      if (((ulong)pDVar5 & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",pDVar5);
      }
      MachineState.pvar[-1] = (DLword)((uint)((int)pDVar5 - (int)Lisp_world) >> 1);
    }
    uVar10 = (long)pFVar7 - (long)Stackspace >> 1;
    if (0xffff < uVar10) {
      printf("Stack offset is out of range: 0x%tx\n",uVar10);
    }
    MachineState.pvar[-2] = (short)uVar10 + 10;
    MachineState.pvar[-10] = (short)*(undefined4 *)(MachineState.pvar + -2) + 1;
  }
  return pFVar7;
}

Assistant:

static FX *make_FXcopy(FX *fx68k) {
  int size;
  int nametbl_on_stk = NIL;
  DLword *new68k;
  Bframe *retbf68k;

#ifdef FLIPCURSOR
  flip_cursorbar(5);
#endif

  CHECK_FX(fx68k);
  size = FX_size(fx68k) + DLWORDSPER_CELL;
#ifdef BIGVM
  if (fx68k->validnametable && ((fx68k->nametable >> 16) == STK_HI))
#else
  if (fx68k->validnametable && (fx68k->hi2nametable == STK_HI))
#endif /* BIGVM */
  {
/* frame contains a name table, so we care that the alignment
 of the new block be same as old */
#ifdef STACKCHECK
    {
      DLword n;
#ifdef BIGVM
      n = fx68k->nametable & 0xFFFF;
#else
      n = fx68k->lonametable;
#endif /* BIGVM */
      if ((n <= StackOffsetFromNative(fx68k)) && (n >= fx68k->nextblock))
        error("hardreturn:nametable check");
    }
#endif
    nametbl_on_stk = T;
    /* Find a free stack block */
    new68k = freestackblock(size, (StackWord *)CURRENTFX,
                            (StackOffsetFromNative(fx68k) - DLWORDSPER_CELL) % DLWORDSPER_QUAD);
  } /*if end */
  else
    new68k = freestackblock(size, (StackWord *)CURRENTFX, -1); /* No align */

  if (new68k == 0) return (0); /* No more space for STACK */

  /* blt(dest,source,size) */
  blt(new68k, (((DLword *)fx68k) - DLWORDSPER_CELL), size);

  ((Bframe *)new68k)->residual = T;
  new68k = new68k + DLWORDSPER_CELL; /* now NEW points to the FX */
  ((FX *)new68k)->nextblock = (StackOffsetFromNative(new68k) + size) - DLWORDSPER_CELL;
  retbf68k = (Bframe *)NativeAligned4FromStackOffset(GETBLINK(fx68k));
  /* Set true BFptr,not the residual */
  SETBLINK(new68k, GETBLINK(fx68k));
  ((FX *)new68k)->usecount = 0;
  CHECK_BF(retbf68k);

#ifdef BIGVM
  if (nametbl_on_stk) ((FX *)new68k)->nametable += (((UNSIGNED)new68k - (UNSIGNED)fx68k) >> 1);
#else
  if (nametbl_on_stk) ((FX *)new68k)->lonametable += (((UNSIGNED)new68k - (UNSIGNED)fx68k) >> 1);
#endif
  /* increment use count of basic frame of returnee because
  we made another FX which points to it */
  retbf68k->usecnt++;
  SET_FASTP_NIL(fx68k);
  /* increment use count of CLINK of returnee
     because we made a copy of returnee */
  incusecount68k((FX *)NativeAligned4FromStackOffset(GETCLINK(fx68k)));

  if (GETCLINK(fx68k) != GETALINK(fx68k)) {
    incusecount68k((FX *)NativeAligned4FromStackOffset(GETALINK(fx68k)));
  }

  decusecount68k(fx68k); /* if usecon==0  -> FSB */
  SETACLINK(CURRENTFX, StackOffsetFromNative(new68k));
  CHECK_FX((FX *)new68k);
  CHECK_FX(CURRENTFX);
#ifdef STACKCHECK
  stack_check(0);
#endif
#ifdef FLIPCURSOR
  flip_cursorbar(5);
#endif

  return ((FX *)new68k);
}